

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

ExtPrivkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPrivkey
          (ExtPrivkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  uint32_t uVar1;
  uint8_t uVar2;
  undefined3 uVar3;
  uint32_t uVar4;
  NetType NVar5;
  CfdException *this_00;
  undefined1 local_48 [32];
  
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_);
    uVar1 = (this->extprivkey_).fingerprint_;
    uVar2 = (this->extprivkey_).depth_;
    uVar3 = *(undefined3 *)&(this->extprivkey_).field_0x21;
    uVar4 = (this->extprivkey_).child_num_;
    __return_storage_ptr__->version_ = (this->extprivkey_).version_;
    __return_storage_ptr__->fingerprint_ = uVar1;
    __return_storage_ptr__->depth_ = uVar2;
    *(undefined3 *)&__return_storage_ptr__->field_0x21 = uVar3;
    __return_storage_ptr__->child_num_ = uVar4;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &__return_storage_ptr__->chaincode_,&(this->extprivkey_).chaincode_.data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &__return_storage_ptr__->privkey_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->extprivkey_).privkey_);
    uVar3 = *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19;
    NVar5 = (this->extprivkey_).privkey_.net_type_;
    (__return_storage_ptr__->privkey_).is_compressed_ = (this->extprivkey_).privkey_.is_compressed_;
    *(undefined3 *)&(__return_storage_ptr__->privkey_).field_0x19 = uVar3;
    (__return_storage_ptr__->privkey_).net_type_ = NVar5;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &__return_storage_ptr__->tweak_sum_,&(this->extprivkey_).tweak_sum_.data_);
    return __return_storage_ptr__;
  }
  local_48._0_8_ = "cfdcore_descriptor.cpp";
  local_48._8_4_ = 0x19f;
  local_48._16_8_ = "GetExtPrivkey";
  logger::log<>((CfdSourceLocation *)local_48,kCfdLogLevelWarning,
                "Failed to GetExtPrivkey. unsupported key type.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"GetExtPrivkey unsupported key type.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey DescriptorKeyReference::GetExtPrivkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_;
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPrivkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPrivkey unsupported key type.");
}